

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.hpp
# Opt level: O3

void __thiscall
Qentem::Value<char16_t>::SetValueAndKey
          (Value<char16_t> *this,SizeT index,Value<char16_t> **value,StringViewT *key)

{
  uint uVar1;
  SizeT SVar2;
  Value<char16_t> *pVVar3;
  undefined8 *puVar4;
  
  for (; this->type_ == ValuePtr; this = (this->field_0).array_.storage_) {
  }
  if (this->type_ != Object) {
    return;
  }
  if (index < (this->field_0).array_.index_) {
    uVar1 = (this->field_0).array_.capacity_;
    pVVar3 = (this->field_0).array_.storage_;
    if (*(int *)(&pVVar3[(ulong)index * 2].type_ + (ulong)uVar1 * 4) != 0) {
      puVar4 = (undefined8 *)((long)&pVVar3[(ulong)index * 2].field_0 + (ulong)uVar1 * 4);
      *value = (Value<char16_t> *)0x0;
      if (*(char *)(puVar4 + 5) == '\0') {
        return;
      }
      *value = (Value<char16_t> *)(puVar4 + 3);
      SVar2 = *(SizeT *)(puVar4 + 1);
      key->storage_ = (char16_t *)*puVar4;
      key->length_ = SVar2;
      return;
    }
  }
  *value = (Value<char16_t> *)0x0;
  return;
}

Assistant:

inline ValueType Type() const noexcept {
        return type_;
    }